

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Deflate.cpp
# Opt level: O0

void __thiscall DeflateDecoder::run(DeflateDecoder *this)

{
  ostream *poVar1;
  string local_138;
  string local_118;
  undefined1 local_f8 [8];
  Lz77Decoder lz77;
  string local_98;
  undefined1 local_78 [8];
  HuffmanDecoder huffman;
  DeflateDecoder *this_local;
  
  huffman.nodes_.
  super__List_base<std::shared_ptr<HuffmanNode>,_std::allocator<std::shared_ptr<HuffmanNode>_>_>.
  _M_impl._M_node._M_size = (size_t)this;
  poVar1 = std::operator<<((ostream *)&std::cout,"Deflate decryption...");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  Cryptor::get_in_message_abi_cxx11_(&local_98,&this->super_Cryptor);
  HuffmanDecoder::HuffmanDecoder((HuffmanDecoder *)local_78,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  HuffmanDecoder::run((HuffmanDecoder *)local_78);
  Cryptor::get_out_message_abi_cxx11_(&local_118,(Cryptor *)local_78);
  Lz77Decoder::Lz77Decoder((Lz77Decoder *)local_f8,&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  Lz77Decoder::run((Lz77Decoder *)local_f8);
  Cryptor::get_out_message_abi_cxx11_(&local_138,(Cryptor *)local_f8);
  Cryptor::set_out_message(&this->super_Cryptor,&local_138);
  std::__cxx11::string::~string((string *)&local_138);
  poVar1 = std::operator<<((ostream *)&std::cout,"decryption done");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  Lz77Decoder::~Lz77Decoder((Lz77Decoder *)local_f8);
  HuffmanDecoder::~HuffmanDecoder((HuffmanDecoder *)local_78);
  return;
}

Assistant:

void DeflateDecoder::run() {
  cout << "Deflate decryption..." << endl;

  HuffmanDecoder huffman(get_in_message());
  huffman.run();
  Lz77Decoder lz77(huffman.get_out_message());
  lz77.run();
  set_out_message(lz77.get_out_message());

  cout << "decryption done" << endl;
}